

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall Console::Console(Console *this)

{
  (this->commands)._M_h._M_buckets = &(this->commands)._M_h._M_single_bucket;
  (this->commands)._M_h._M_bucket_count = 1;
  (this->commands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->commands)._M_h._M_element_count = 0;
  (this->commands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->commands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->commands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->printBuffer);
  registerHelpCommand(this);
  return;
}

Assistant:

Console::Console()
{
    registerHelpCommand();
}